

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test5::GPUShaderFP64Test5(GPUShaderFP64Test5 *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"conversions",
             "Verifies explicit and implicit casts involving double-precision floating-point variables work correctly"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020d34d8;
  this->m_base_value_bo_data = (uchar *)0x0;
  this->m_base_value_bo_id = 0;
  this->m_has_test_passed = true;
  this->m_po_base_value_attribute_location = -1;
  this->m_po_id = 0;
  this->m_vao_id = 0;
  this->m_vs_id = 0;
  this->m_xfb_bo_id = 0;
  this->m_xfb_bo_size = 0;
  this->m_base_values[0] = -25.12065;
  this->m_base_values[1] = 0.0;
  this->m_base_values[2] = 0.001;
  this->m_base_values[3] = 1.0;
  this->m_base_values[4] = 256.789;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 0) + 0) = SWIZZLE_TYPE_NONE;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 0) + 4) = SWIZZLE_TYPE_Y;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 0) + 8) = SWIZZLE_TYPE_Z;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 0) + 0xc) = SWIZZLE_TYPE_W;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 1) + 0) = SWIZZLE_TYPE_NONE;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 1) + 4) = SWIZZLE_TYPE_YX;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 1) + 8) = SWIZZLE_TYPE_ZY;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 1) + 0xc) = SWIZZLE_TYPE_WX;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 2) + 0) = SWIZZLE_TYPE_NONE;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 2) + 4) = SWIZZLE_TYPE_YXX;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 2) + 8) = SWIZZLE_TYPE_XZY;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 2) + 0xc) = SWIZZLE_TYPE_XWZY;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 3) + 0) = SWIZZLE_TYPE_NONE;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 3) + 4) = SWIZZLE_TYPE_YXXY;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 3) + 8) = SWIZZLE_TYPE_XZXY;
  *(_swizzle_type *)((long)(this->m_swizzle_matrix + 3) + 0xc) = SWIZZLE_TYPE_XZYW;
  return;
}

Assistant:

GPUShaderFP64Test5::GPUShaderFP64Test5(deqp::Context& context)
	: TestCase(context, "conversions", "Verifies explicit and implicit casts involving double-precision"
									   " floating-point variables work correctly")
	, m_base_value_bo_data(DE_NULL)
	, m_base_value_bo_id(0)
	, m_has_test_passed(true)
	, m_po_base_value_attribute_location(-1)
	, m_po_id(0)
	, m_vao_id(0)
	, m_vs_id(0)
	, m_xfb_bo_id(0)
	, m_xfb_bo_size(0)
{
	/* Set up base value array (as per test spec) */
	m_base_values[0] = -25.12065f;
	m_base_values[1] = 0.0f;
	m_base_values[2] = 0.001f;
	m_base_values[3] = 1.0f;
	m_base_values[4] = 256.78901f;

	/* Set up swizzle matrix */
	m_swizzle_matrix[0][0] = SWIZZLE_TYPE_NONE;
	m_swizzle_matrix[0][1] = SWIZZLE_TYPE_Y;
	m_swizzle_matrix[0][2] = SWIZZLE_TYPE_Z;
	m_swizzle_matrix[0][3] = SWIZZLE_TYPE_W;
	m_swizzle_matrix[1][0] = SWIZZLE_TYPE_NONE;
	m_swizzle_matrix[1][1] = SWIZZLE_TYPE_YX;
	m_swizzle_matrix[1][2] = SWIZZLE_TYPE_ZY;
	m_swizzle_matrix[1][3] = SWIZZLE_TYPE_WX;
	m_swizzle_matrix[2][0] = SWIZZLE_TYPE_NONE;
	m_swizzle_matrix[2][1] = SWIZZLE_TYPE_YXX;
	m_swizzle_matrix[2][2] = SWIZZLE_TYPE_XZY;
	m_swizzle_matrix[2][3] = SWIZZLE_TYPE_XWZY;
	m_swizzle_matrix[3][0] = SWIZZLE_TYPE_NONE;
	m_swizzle_matrix[3][1] = SWIZZLE_TYPE_YXXY;
	m_swizzle_matrix[3][2] = SWIZZLE_TYPE_XZXY;
	m_swizzle_matrix[3][3] = SWIZZLE_TYPE_XZYW;
}